

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O2

void __thiscall FShaderProgram::CreateShader(FShaderProgram *this,ShaderType type)

{
  GLuint GVar1;
  
  GVar1 = (*_ptrc_glCreateShader)(type == Fragment ^ 0x8b31);
  this->mShaders[type] = GVar1;
  return;
}

Assistant:

void FShaderProgram::CreateShader(ShaderType type)
{
	GLenum gltype = 0;
	switch (type)
	{
	default:
	case Vertex: gltype = GL_VERTEX_SHADER; break;
	case Fragment: gltype = GL_FRAGMENT_SHADER; break;
	}
	mShaders[type] = glCreateShader(gltype);
}